

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_dpb_mgr.c
# Opt level: O1

WORD32 ihevc_dpb_mgr_insert_ref(dpb_mgr_t *ps_dpb_mgr,pic_buf_t *ps_pic_buf,WORD32 buf_id)

{
  dpb_info_t *pdVar1;
  pic_buf_t *ppVar2;
  WORD32 WVar3;
  long lVar4;
  dpb_info_t *pdVar5;
  ulong uVar6;
  
  pdVar1 = ps_dpb_mgr->as_dpb_info;
  lVar4 = 8;
  do {
    ppVar2 = *(pic_buf_t **)((long)ps_dpb_mgr->as_dpb_info + lVar4 + -8);
    if ((ppVar2 == ps_pic_buf) && (ppVar2->u1_used_as_ref != '\0')) {
      return -1;
    }
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x408);
  uVar6 = 0;
  pdVar5 = pdVar1;
  do {
    if (pdVar5->ps_pic_buf == (pic_buf_t *)0x0) goto LAB_0016b890;
    uVar6 = uVar6 + 1;
    pdVar5 = pdVar5 + 1;
  } while (uVar6 != 0x40);
  uVar6 = 0x40;
LAB_0016b890:
  WVar3 = -1;
  if ((int)uVar6 != 0x40) {
    uVar6 = uVar6 & 0xffffffff;
    pdVar1[uVar6].ps_pic_buf = ps_pic_buf;
    ps_dpb_mgr->as_dpb_info[uVar6].ps_prev_dpb = ps_dpb_mgr->ps_dpb_head;
    ps_pic_buf->u1_buf_id = (UWORD8)buf_id;
    ps_pic_buf->u1_used_as_ref = '\x02';
    ps_dpb_mgr->ps_dpb_head = pdVar1 + uVar6;
    ps_dpb_mgr->u1_num_ref_bufs = ps_dpb_mgr->u1_num_ref_bufs + '\x01';
    WVar3 = 0;
  }
  return WVar3;
}

Assistant:

WORD32 ihevc_dpb_mgr_insert_ref(dpb_mgr_t *ps_dpb_mgr,
                                pic_buf_t *ps_pic_buf,
                                WORD32 buf_id)
{
    int i;
    dpb_info_t *ps_dpb_info;

    ps_dpb_info = ps_dpb_mgr->as_dpb_info;

    /* Return error if buffer is already present in the DPB */
    for(i = 0; i < MAX_DPB_BUFS; i++)
    {
        if((ps_dpb_info[i].ps_pic_buf == ps_pic_buf)
                        && (ps_dpb_info[i].ps_pic_buf->u1_used_as_ref))
        {
            return (-1);
        }


    }

    /* Find an unused DPB location */
    for(i = 0; i < MAX_DPB_BUFS; i++)
    {
        if(NULL == ps_dpb_info[i].ps_pic_buf)
        {
            break;
        }
    }
    if(i == MAX_DPB_BUFS)
    {
        return (-1);
    }

    /* Create DPB info */
    ps_dpb_info[i].ps_pic_buf = ps_pic_buf;
    ps_dpb_info[i].ps_prev_dpb = ps_dpb_mgr->ps_dpb_head;
    ps_dpb_info[i].ps_pic_buf->u1_buf_id = buf_id;
    ps_dpb_info[i].ps_pic_buf->u1_used_as_ref = SHORT_TERM_REF;

    /* update the head node of linked list to point to the current picture */
    ps_dpb_mgr->ps_dpb_head = ps_dpb_info + i;

    /* Increment Short term buffer count */
    ps_dpb_mgr->u1_num_ref_bufs++;

    return 0;
}